

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printmetrics.h
# Opt level: O0

bool MetricsDiscovery::printMetricsHelper(bool devicesOnly)

{
  void *pvVar1;
  byte in_DIL;
  bool success;
  void *pLibrary;
  void *in_stack_00000018;
  bool in_stack_00000067;
  void *in_stack_00000068;
  bool local_11;
  bool local_1;
  
  pvVar1 = OpenLibrary();
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"Couldn\'t load metrics discovery library!\n");
    local_1 = false;
  }
  else {
    local_11 = printMetricsForAdapterGroup(in_stack_00000068,in_stack_00000067);
    if ((!local_11) && ((in_DIL & 1) == 0)) {
      local_11 = printMetricsForLegacyDevice(in_stack_00000018);
    }
    local_1 = local_11;
  }
  return local_1;
}

Assistant:

static bool printMetricsHelper(bool devicesOnly)
{
    void* pLibrary = OpenLibrary();
    if (pLibrary == NULL)
    {
        fprintf(stderr, "Couldn't load metrics discovery library!\n");
        return false;
    }

    bool success = printMetricsForAdapterGroup(pLibrary, devicesOnly);
    if (!success && !devicesOnly)
    {
        success = printMetricsForLegacyDevice(pLibrary);
    }

    return success;
}